

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::findBucketWithHash<QString>
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this,QString *key,size_t hash)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  char16_t *pcVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  Span *pSVar9;
  Span *pSVar10;
  ulong uVar11;
  QStringView rhs;
  QStringView lhs;
  Bucket BVar12;
  
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  uVar11 = uVar3 - 1 & hash;
  pSVar9 = pSVar4 + (uVar11 >> 7);
  uVar11 = (ulong)((uint)uVar11 & 0x7f);
  pcVar5 = (key->d).ptr;
  lVar6 = (key->d).size;
  do {
    bVar2 = pSVar9->offsets[uVar11];
    if ((ulong)bVar2 == 0xff) {
LAB_004bffba:
      bVar8 = false;
    }
    else {
      lVar1 = (ulong)bVar2 * 0x80 + (ulong)bVar2 * 8;
      lVar7 = *(long *)((pSVar9->entries->storage).data + lVar1 + 0x10);
      if (lVar7 == lVar6) {
        rhs.m_data = pcVar5;
        rhs.m_size = lVar6;
        lhs.m_data = *(storage_type_conflict **)((pSVar9->entries->storage).data + lVar1 + 8);
        lhs.m_size = lVar7;
        bVar8 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar8) goto LAB_004bffba;
      }
      uVar11 = uVar11 + 1;
      bVar8 = true;
      if (uVar11 == 0x80) {
        pSVar10 = pSVar9 + 1;
        pSVar9 = pSVar4;
        if (((long)pSVar10 - (long)pSVar4 >> 4) * -0x71c71c71c71c71c7 - (uVar3 >> 7) != 0) {
          pSVar9 = pSVar10;
        }
        uVar11 = 0;
      }
    }
    if (!bVar8) {
      BVar12.index = uVar11;
      BVar12.span = pSVar9;
      return BVar12;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }